

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximp.cpp
# Opt level: O1

UChar32 __thiscall icu_63::CaseFoldingUTextIterator::next(CaseFoldingUTextIterator *this)

{
  UChar UVar1;
  int iVar2;
  UText *ut;
  uint uVar3;
  uint uVar4;
  
  if (this->fFoldChars == (UChar *)0x0) {
    ut = this->fUText;
    iVar2 = ut->chunkOffset;
    if ((iVar2 < ut->chunkLength) &&
       (uVar3 = (uint)(ushort)ut->chunkContents[iVar2], (ushort)ut->chunkContents[iVar2] < 0xd800))
    {
      ut->chunkOffset = iVar2 + 1;
    }
    else {
      uVar3 = utext_next32_63(ut);
    }
    if (uVar3 == 0xffffffff) {
      return -1;
    }
    uVar3 = ucase_toFullFolding_63(uVar3,&this->fFoldChars,0);
    this->fFoldLength = uVar3;
    if (0x1e < uVar3) {
      if ((int)uVar3 < 0) {
        this->fFoldLength = ~uVar3;
      }
      uVar3 = this->fFoldLength;
      goto LAB_0026f0c7;
    }
    this->fFoldIndex = 0;
  }
  iVar2 = this->fFoldIndex;
  this->fFoldIndex = iVar2 + 1;
  UVar1 = this->fFoldChars[iVar2];
  uVar3 = (uint)(ushort)UVar1;
  if ((((UVar1 & 0xfc00U) == 0xd800) && (iVar2 + 1 != this->fFoldLength)) &&
     (uVar4 = (uint)(ushort)this->fFoldChars[(long)iVar2 + 1], (uVar4 & 0xfc00) == 0xdc00)) {
    this->fFoldIndex = iVar2 + 2;
    uVar3 = (uint)(ushort)UVar1 * 0x400 + uVar4 + 0xfca02400;
  }
  if (this->fFoldIndex < this->fFoldLength) {
    return uVar3;
  }
LAB_0026f0c7:
  this->fFoldChars = (UChar *)0x0;
  return uVar3;
}

Assistant:

UChar32 CaseFoldingUTextIterator::next() {
    UChar32  foldedC;
    UChar32  originalC;
    if (fFoldChars == NULL) {
        // We are not in a string folding of an earlier character.
        // Start handling the next char from the input UText.
        originalC = UTEXT_NEXT32(&fUText);
        if (originalC == U_SENTINEL) {
            return originalC;
        }
        fFoldLength = ucase_toFullFolding(originalC, &fFoldChars, U_FOLD_CASE_DEFAULT);
        if (fFoldLength >= UCASE_MAX_STRING_LENGTH || fFoldLength < 0) {
            // input code point folds to a single code point, possibly itself.
            // See comment in ucase.h for explanation of return values from ucase_toFullFoldings.
            if (fFoldLength < 0) {
                fFoldLength = ~fFoldLength;
            }
            foldedC = (UChar32)fFoldLength;
            fFoldChars = NULL;
            return foldedC;
        }
        // String foldings fall through here.
        fFoldIndex = 0;
    }

    U16_NEXT(fFoldChars, fFoldIndex, fFoldLength, foldedC);
    if (fFoldIndex >= fFoldLength) {
        fFoldChars = NULL;
    }
    return foldedC;
}